

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::config::load_config_file(config *this,string *config_path)

{
  const_iterator __position;
  istream *piVar1;
  ostream *poVar2;
  runtime_error *this_00;
  disk_list_type *this_01;
  vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_> flash_list;
  string line;
  string local_3d0 [32];
  disk_config entry;
  ifstream cfg_file;
  byte abStack_218 [488];
  
  flash_list.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flash_list.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flash_list.super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&cfg_file,(config_path->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_cfg_file + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&cfg_file,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
        entry.path._M_dataplus._M_p = (pointer)&entry.path.field_2;
        entry.path._M_string_length = 0;
        entry.path.field_2._M_local_buf[0] = '\0';
        entry.size = 0;
        entry.io_impl._M_dataplus._M_p = (pointer)&entry.io_impl.field_2;
        entry.io_impl._M_string_length = 0;
        entry.io_impl.field_2._M_local_buf[0] = '\0';
        entry.autogrow = true;
        entry.delete_on_exit = false;
        entry.direct = DIRECT_TRY;
        entry.flash = false;
        entry.queue = -1;
        entry.device_id = 0xffffffff;
        entry.raw_device = false;
        entry.unlink_on_open = false;
        entry.queue_length = 0;
        disk_config::parse_line(&entry,&line);
        this_01 = &this->disks_list;
        if (entry.flash != false) {
          this_01 = &flash_list;
        }
        std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::push_back
                  (this_01,&entry);
        disk_config::~disk_config(&entry);
      }
    }
    std::ifstream::close();
    __position._M_current =
         (this->disks_list).
         super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
         super__Vector_impl_data._M_finish;
    this->first_flash =
         (uint)(((long)__position._M_current -
                (long)(this->disks_list).
                      super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x68);
    std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>::
    insert<__gnu_cxx::__normal_iterator<foxxll::disk_config*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>,void>
              ((vector<foxxll::disk_config,std::allocator<foxxll::disk_config>> *)&this->disks_list,
               __position,
               (__normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
                )flash_list.
                 super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
                )flash_list.
                 super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    if ((this->disks_list).
        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->disks_list).
        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&entry);
      poVar2 = std::operator<<((ostream *)&entry,"Error in ");
      poVar2 = std::operator<<(poVar2,
                               "virtual void foxxll::config::load_config_file(const std::string &)")
      ;
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,"No disks found in \'");
      poVar2 = std::operator<<(poVar2,(string *)config_path);
      std::operator<<(poVar2,"\'.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_3d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    (*this->_vptr_config[5])(this);
  }
  std::ifstream::~ifstream(&cfg_file);
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector(&flash_list);
  return;
}

Assistant:

void config::load_config_file(const std::string& config_path)
{
    std::vector<disk_config> flash_list;
    std::ifstream cfg_file(config_path.c_str());

    if (!cfg_file)
        return load_default_config();

    std::string line;

    while (std::getline(cfg_file, line))
    {
        // skip comments
        if (line.size() == 0 || line[0] == '#') continue;

        disk_config entry;
        entry.parse_line(line); // throws on errors

        if (!entry.flash)
            disks_list.push_back(entry);
        else
            flash_list.push_back(entry);
    }
    cfg_file.close();

    // put flash devices after regular disks
    first_flash = static_cast<unsigned int>(disks_list.size());
    disks_list.insert(disks_list.end(), flash_list.begin(), flash_list.end());

    if (disks_list.empty()) {
        FOXXLL_THROW(
            std::runtime_error,
            "No disks found in '" << config_path << "'."
        );
    }
}